

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verify.cpp
# Opt level: O2

int libtorrent::ed25519_verify
              (uchar *signature,uchar *message,ptrdiff_t message_len,uchar *public_key)

{
  int iVar1;
  uint uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  span<const_char> data;
  span<const_char> data_00;
  span<const_char> data_01;
  uchar checker [32];
  sha512_hash h;
  hasher512 hash;
  ge_p2 R;
  ge_p3 A;
  
  uVar2 = 0;
  if (signature[0x3f] < 0x20) {
    iVar1 = ge_frombytes_negate_vartime(&A,public_key);
    if (iVar1 == 0) {
      hasher512::hasher512(&hash);
      data.m_len = 0x20;
      data.m_ptr = (char *)signature;
      hasher512::update(&hash,data);
      data_00.m_len = 0x20;
      data_00.m_ptr = (char *)public_key;
      hasher512::update(&hash,data_00);
      data_01.m_len = message_len;
      data_01.m_ptr = (char *)message;
      hasher512::update(&hash,data_01);
      hasher512::final(&h,&hash);
      sc_reduce((uchar *)&h);
      ge_double_scalarmult_vartime(&R,(uchar *)&h,&A,signature + 0x20);
      ge_tobytes(checker,&R);
      auVar3[0] = -(signature[0x10] == checker[0x10]);
      auVar3[1] = -(signature[0x11] == checker[0x11]);
      auVar3[2] = -(signature[0x12] == checker[0x12]);
      auVar3[3] = -(signature[0x13] == checker[0x13]);
      auVar3[4] = -(signature[0x14] == checker[0x14]);
      auVar3[5] = -(signature[0x15] == checker[0x15]);
      auVar3[6] = -(signature[0x16] == checker[0x16]);
      auVar3[7] = -(signature[0x17] == checker[0x17]);
      auVar3[8] = -(signature[0x18] == checker[0x18]);
      auVar3[9] = -(signature[0x19] == checker[0x19]);
      auVar3[10] = -(signature[0x1a] == checker[0x1a]);
      auVar3[0xb] = -(signature[0x1b] == checker[0x1b]);
      auVar3[0xc] = -(signature[0x1c] == checker[0x1c]);
      auVar3[0xd] = -(signature[0x1d] == checker[0x1d]);
      auVar3[0xe] = -(signature[0x1e] == checker[0x1e]);
      auVar3[0xf] = -(signature[0x1f] == checker[0x1f]);
      auVar4[0] = -(*signature == checker[0]);
      auVar4[1] = -(signature[1] == checker[1]);
      auVar4[2] = -(signature[2] == checker[2]);
      auVar4[3] = -(signature[3] == checker[3]);
      auVar4[4] = -(signature[4] == checker[4]);
      auVar4[5] = -(signature[5] == checker[5]);
      auVar4[6] = -(signature[6] == checker[6]);
      auVar4[7] = -(signature[7] == checker[7]);
      auVar4[8] = -(signature[8] == checker[8]);
      auVar4[9] = -(signature[9] == checker[9]);
      auVar4[10] = -(signature[10] == checker[10]);
      auVar4[0xb] = -(signature[0xb] == checker[0xb]);
      auVar4[0xc] = -(signature[0xc] == checker[0xc]);
      auVar4[0xd] = -(signature[0xd] == checker[0xd]);
      auVar4[0xe] = -(signature[0xe] == checker[0xe]);
      auVar4[0xf] = -(signature[0xf] == checker[0xf]);
      auVar4 = auVar4 & auVar3;
      uVar2 = (uint)((ushort)((ushort)(SUB161(auVar4 >> 7,0) & 1) |
                              (ushort)(SUB161(auVar4 >> 0xf,0) & 1) << 1 |
                              (ushort)(SUB161(auVar4 >> 0x17,0) & 1) << 2 |
                              (ushort)(SUB161(auVar4 >> 0x1f,0) & 1) << 3 |
                              (ushort)(SUB161(auVar4 >> 0x27,0) & 1) << 4 |
                              (ushort)(SUB161(auVar4 >> 0x2f,0) & 1) << 5 |
                              (ushort)(SUB161(auVar4 >> 0x37,0) & 1) << 6 |
                              (ushort)(SUB161(auVar4 >> 0x3f,0) & 1) << 7 |
                              (ushort)(SUB161(auVar4 >> 0x47,0) & 1) << 8 |
                              (ushort)(SUB161(auVar4 >> 0x4f,0) & 1) << 9 |
                              (ushort)(SUB161(auVar4 >> 0x57,0) & 1) << 10 |
                              (ushort)(SUB161(auVar4 >> 0x5f,0) & 1) << 0xb |
                              (ushort)(SUB161(auVar4 >> 0x67,0) & 1) << 0xc |
                              (ushort)(SUB161(auVar4 >> 0x6f,0) & 1) << 0xd |
                              (ushort)(SUB161(auVar4 >> 0x77,0) & 1) << 0xe |
                             (ushort)(byte)(auVar4[0xf] >> 7) << 0xf) == 0xffff);
      hasher512::~hasher512(&hash);
    }
  }
  return uVar2;
}

Assistant:

int ed25519_verify(const unsigned char *signature, const unsigned char *message, std::ptrdiff_t message_len, const unsigned char *public_key) {
    unsigned char checker[32];
    ge_p3 A;
    ge_p2 R;

    if (signature[63] & 224) {
        return 0;
    }

    if (ge_frombytes_negate_vartime(&A, public_key) != 0) {
        return 0;
    }

    hasher512 hash;
    hash.update({reinterpret_cast<char const*>(signature), 32});
    hash.update({reinterpret_cast<char const*>(public_key), 32});
    hash.update({reinterpret_cast<char const*>(message), message_len});
    sha512_hash h = hash.final();
    
    sc_reduce(reinterpret_cast<unsigned char*>(h.data()));
    ge_double_scalarmult_vartime(&R, reinterpret_cast<unsigned char*>(h.data())
        , &A, signature + 32);
    ge_tobytes(checker, &R);

    if (!consttime_equal(checker, signature)) {
        return 0;
    }

    return 1;
}